

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  void *pvVar1;
  ostream *poVar2;
  long lVar3;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<nanoNet::DataPoint> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<float> __l_11;
  NeuralNetwork network;
  Trainer trainer;
  DataSet data;
  vector<float,_std::allocator<float>_> local_198;
  allocator_type local_179;
  allocator_type local_178;
  allocator_type local_177;
  allocator_type local_176;
  allocator_type local_175;
  allocator_type local_174;
  allocator_type local_173;
  allocator_type local_172;
  allocator_type local_171;
  undefined8 local_170;
  float local_168 [2];
  undefined8 local_160;
  NeuralNetwork local_158;
  Trainer local_140;
  undefined1 local_128 [24];
  vector<float,_std::allocator<float>_> local_110;
  vector<float,_std::allocator<float>_> local_f8;
  vector<float,_std::allocator<float>_> local_e0;
  vector<float,_std::allocator<float>_> local_c8;
  vector<float,_std::allocator<float>_> local_b0;
  vector<float,_std::allocator<float>_> local_98;
  vector<float,_std::allocator<float>_> local_80;
  vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_> local_68;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_> local_40;
  
  nanoNet::NeuralNetwork::NeuralNetwork(&local_158);
  local_68.super__Vector_base<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  nanoNet::ActivationFunction::ActivationFunction
            ((ActivationFunction *)&local_140,(Which *)&local_68);
  nanoNet::NeuralNetworkLayer::NeuralNetworkLayer
            ((NeuralNetworkLayer *)local_128,2,8,(ActivationFunction *)&local_140);
  nanoNet::NeuralNetwork::addLayer(&local_158,(NeuralNetworkLayer *)local_128);
  nanoNet::NeuralNetworkLayer::~NeuralNetworkLayer((NeuralNetworkLayer *)local_128);
  local_68.super__Vector_base<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  nanoNet::ActivationFunction::ActivationFunction
            ((ActivationFunction *)&local_140,(Which *)&local_68);
  nanoNet::NeuralNetworkLayer::NeuralNetworkLayer
            ((NeuralNetworkLayer *)local_128,8,1,(ActivationFunction *)&local_140);
  nanoNet::NeuralNetwork::addLayer(&local_158,(NeuralNetworkLayer *)local_128);
  nanoNet::NeuralNetworkLayer::~NeuralNetworkLayer((NeuralNetworkLayer *)local_128);
  local_140.epoch_count = 10000;
  local_140.batch_size = 2;
  local_140.learning_rate = 0.002;
  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_198;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_128,__l,&local_171);
  local_44 = 0.0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_44;
  std::vector<float,_std::allocator<float>_>::vector(&local_110,__l_00,&local_172);
  local_160 = 0x3f80000000000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_160;
  std::vector<float,_std::allocator<float>_>::vector(&local_f8,__l_01,&local_173);
  local_48 = 1.0;
  __l_02._M_len = 1;
  __l_02._M_array = &local_48;
  std::vector<float,_std::allocator<float>_>::vector(&local_e0,__l_02,&local_174);
  local_168[0] = 1.0;
  local_168[1] = 0.0;
  __l_03._M_len = 2;
  __l_03._M_array = local_168;
  std::vector<float,_std::allocator<float>_>::vector(&local_c8,__l_03,&local_175);
  local_4c = 1.0;
  __l_04._M_len = 1;
  __l_04._M_array = &local_4c;
  std::vector<float,_std::allocator<float>_>::vector(&local_b0,__l_04,&local_176);
  local_170 = 0x3f8000003f800000;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_170;
  std::vector<float,_std::allocator<float>_>::vector(&local_98,__l_05,&local_177);
  local_50 = 0.0;
  __l_06._M_len = 1;
  __l_06._M_array = &local_50;
  std::vector<float,_std::allocator<float>_>::vector(&local_80,__l_06,&local_178);
  __l_07._M_len = 4;
  __l_07._M_array = (iterator)local_128;
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::vector
            (&local_68,__l_07,&local_179);
  lVar3 = 0xc0;
  do {
    pvVar1 = *(void **)((long)&local_140.epoch_count + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_128 + lVar3 + -8) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)&local_158.m_layers.
                               super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_158.m_layers.
                                              super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != 0);
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::vector(&local_40,&local_68);
  nanoNet::Trainer::train(&local_140,&local_158,&local_40);
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::~vector(&local_40);
  local_128[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_128,1);
  local_160 = 0;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_160;
  std::vector<float,_std::allocator<float>_>::vector(&local_198,__l_08,(allocator_type *)&local_170)
  ;
  nanoNet::NeuralNetwork::predict((vector_type *)local_128,&local_158,&local_198);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)(int)(*(float *)CONCAT71(local_128._1_7_,local_128[0]) +
                                            *(float *)CONCAT71(local_128._1_7_,local_128[0]) + 0.5)
                              * 0.5));
  local_168[0]._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_168,1);
  pvVar1 = (void *)CONCAT71(local_128._1_7_,local_128[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_128._16_8_ - (long)pvVar1);
  }
  if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_160 = 0x3f80000000000000;
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)&local_160;
  std::vector<float,_std::allocator<float>_>::vector(&local_198,__l_09,(allocator_type *)&local_170)
  ;
  nanoNet::NeuralNetwork::predict((vector_type *)local_128,&local_158,&local_198);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)(int)(*(float *)CONCAT71(local_128._1_7_,local_128[0]) +
                                            *(float *)CONCAT71(local_128._1_7_,local_128[0]) + 0.5)
                              * 0.5));
  local_168[0]._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_168,1);
  pvVar1 = (void *)CONCAT71(local_128._1_7_,local_128[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_128._16_8_ - (long)pvVar1);
  }
  if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_160 = 0x3f800000;
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)&local_160;
  std::vector<float,_std::allocator<float>_>::vector(&local_198,__l_10,(allocator_type *)&local_170)
  ;
  nanoNet::NeuralNetwork::predict((vector_type *)local_128,&local_158,&local_198);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)(int)(*(float *)CONCAT71(local_128._1_7_,local_128[0]) +
                                            *(float *)CONCAT71(local_128._1_7_,local_128[0]) + 0.5)
                              * 0.5));
  local_168[0]._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_168,1);
  pvVar1 = (void *)CONCAT71(local_128._1_7_,local_128[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_128._16_8_ - (long)pvVar1);
  }
  if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_160 = 0x3f8000003f800000;
  __l_11._M_len = 2;
  __l_11._M_array = (iterator)&local_160;
  std::vector<float,_std::allocator<float>_>::vector(&local_198,__l_11,(allocator_type *)&local_170)
  ;
  nanoNet::NeuralNetwork::predict((vector_type *)local_128,&local_158,&local_198);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)(int)(*(float *)CONCAT71(local_128._1_7_,local_128[0]) +
                                            *(float *)CONCAT71(local_128._1_7_,local_128[0]) + 0.5)
                              * 0.5));
  local_168[0]._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_168,1);
  pvVar1 = (void *)CONCAT71(local_128._1_7_,local_128[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_128._16_8_ - (long)pvVar1);
  }
  if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_128[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_128,1);
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::~vector(&local_68);
  std::vector<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>::~vector
            (&local_158.m_layers);
  return 0;
}

Assistant:

int main() {

    NeuralNetwork network;

    network.addLayer({2, 8, {ActivationFunction::Which::Relu}});
    network.addLayer({8, 1, {ActivationFunction::Which::Linear}});

    // 10000 epochs, batch size = 2, training rate = 0.002
    Trainer trainer { 10000 , 2 , 0.002 };

    Trainer::DataSet data {{
        {{{0.0, 0.0}},{{0.0}}},
        {{{0.0, 1.0}},{{1.0}}},
        {{{1.0, 0.0}},{{1.0}}},
        {{{1.0, 1.0}},{{0.0}}}
    }};

    // stochastic gradient descent
    trainer.train ( network, data );

    auto rnd_base = []( float k ){ return [=]( float x ){ return ( int(x*k+0.5) ) / k; }; };
    auto rnd = rnd_base(2);

    std::cout << '\n';
    std::cout << rnd(network.predict({{0.0, 0.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{0.0, 1.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{1.0, 0.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{1.0, 1.0}})[0]) << '\n';
    std::cout << '\n';

    return 0;
}